

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_cmov(secp256k1_fe *r,secp256k1_fe *a,int flag)

{
  secp256k1_fe *r_00;
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  int iVar153;
  int iVar154;
  uint uVar155;
  ulong uVar156;
  ulong uVar157;
  uint uVar158;
  secp256k1_ge *psVar159;
  secp256k1_ge *psVar160;
  uint n;
  ulong uVar161;
  ulong uVar162;
  ulong uVar163;
  secp256k1_ge *extraout_RDX;
  ulong uVar164;
  ulong uVar165;
  ulong uVar166;
  ulong extraout_RDX_00;
  long lVar167;
  ulong extraout_RDX_01;
  ulong uVar168;
  ulong uVar169;
  uint uVar170;
  secp256k1_ge *psVar171;
  secp256k1_ge *psVar172;
  secp256k1_ge *psVar173;
  secp256k1_ge *a_00;
  ulong uVar174;
  ulong uVar175;
  ulong uVar176;
  ulong uVar177;
  ulong uVar178;
  ulong uVar179;
  ulong uVar180;
  ulong uVar181;
  ulong uVar182;
  ulong uVar183;
  secp256k1_ge *a_01;
  secp256k1_modinv64_signed62 *a_02;
  byte bVar184;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  int vflag;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  undefined1 auStack_320 [48];
  ulong uStack_2f0;
  ulong uStack_2e8;
  secp256k1_ge *psStack_2e0;
  secp256k1_modinv64_signed62 *psStack_2d8;
  secp256k1_ge *psStack_2d0;
  secp256k1_ge *psStack_2c0;
  secp256k1_ge *psStack_2b8;
  secp256k1_ge *psStack_2b0;
  undefined1 auStack_2a8 [96];
  undefined1 auStack_248 [16];
  ulong uStack_238;
  ulong uStack_230;
  byte abStack_228 [32];
  undefined1 auStack_208 [16];
  ulong uStack_1f8;
  ulong uStack_1f0;
  secp256k1_ge *psStack_1e0;
  ulong uStack_1d8;
  ulong uStack_1d0;
  secp256k1_ge *psStack_1c8;
  secp256k1_modinv64_signed62 *psStack_1c0;
  secp256k1_ge *psStack_1b8;
  code *pcStack_1b0;
  long lStack_1a0;
  ulong uStack_198;
  secp256k1_modinv64_signed62 sStack_190;
  secp256k1_fe sStack_168;
  secp256k1_ge *psStack_130;
  secp256k1_ge *psStack_128;
  secp256k1_fe sStack_b8;
  
  bVar184 = 0;
  if ((uint)flag < 2) {
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(r);
    uVar174 = (long)flag - 1;
    uVar156 = -(long)flag;
    r->n[0] = a->n[0] & uVar156 | r->n[0] & uVar174;
    r->n[1] = a->n[1] & uVar156 | r->n[1] & uVar174;
    r->n[2] = a->n[2] & uVar156 | r->n[2] & uVar174;
    r->n[3] = a->n[3] & uVar156 | r->n[3] & uVar174;
    r->n[4] = uVar156 & a->n[4] | uVar174 & r->n[4];
    if (r->magnitude < a->magnitude) {
      r->magnitude = a->magnitude;
    }
    if (a->normalized == 0) {
      r->normalized = 0;
    }
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_cmov_cold_1();
  secp256k1_gej_verify((secp256k1_gej *)r);
  secp256k1_fe_verify(a);
  secp256k1_fe_verify(a);
  uVar174 = (((secp256k1_ge *)a)->x).n[4];
  uVar156 = (uVar174 >> 0x30) * 0x1000003d1 + (((secp256k1_ge *)a)->x).n[0];
  psVar171 = (secp256k1_ge *)0xffffefffffc2f;
  if (((uVar156 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar156 & 0xfffffffffffff) == 0)) {
    uVar161 = (uVar156 >> 0x34) + (((secp256k1_ge *)a)->x).n[1];
    psVar171 = (secp256k1_ge *)((uVar161 >> 0x34) + (((secp256k1_ge *)a)->x).n[2]);
    psVar173 = (secp256k1_ge *)(((ulong)psVar171 >> 0x34) + (((secp256k1_ge *)a)->x).n[3]);
    uVar174 = ((ulong)psVar173 >> 0x34) + (uVar174 & 0xffffffffffff);
    if ((((uVar161 | uVar156 | (ulong)psVar171 | (ulong)psVar173) & 0xfffffffffffff) != 0 ||
         uVar174 != 0) &&
       (((uVar156 | 0x1000003d0) & uVar161 & (ulong)psVar171 & (ulong)psVar173 &
        (uVar174 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_00149f57;
  }
  else {
LAB_00149f57:
    psVar173 = (secp256k1_ge *)a;
    secp256k1_fe_verify(a);
    if ((((secp256k1_ge *)a)->x).magnitude < 9) {
      uVar174 = (((secp256k1_ge *)a)->x).n[0];
      uVar156 = (((secp256k1_ge *)a)->x).n[1];
      uVar161 = (((secp256k1_ge *)a)->x).n[2];
      uVar162 = (((secp256k1_ge *)a)->x).n[3];
      uVar163 = (((secp256k1_ge *)a)->x).n[4];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar174 * 2;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = uVar162;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar156 * 2;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = uVar161;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar163;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = uVar163;
      uVar157 = SUB168(auVar5 * auVar105,0);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar157 & 0xfffffffffffff;
      auVar3 = auVar4 * auVar104 + auVar3 * auVar103 + auVar6 * ZEXT816(0x1000003d10);
      uVar168 = auVar3._0_8_;
      auVar135._8_8_ = 0;
      auVar135._0_8_ = uVar168 >> 0x34 | auVar3._8_8_ << 0xc;
      uVar163 = uVar163 * 2;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar174;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = uVar163;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar156 * 2;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = uVar162;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar161;
      auVar108._8_8_ = 0;
      auVar108._0_8_ = uVar161;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar157 >> 0x34 | SUB168(auVar5 * auVar105,8) << 0xc;
      auVar3 = auVar7 * auVar106 + auVar135 + auVar8 * auVar107 + auVar9 * auVar108 +
               auVar10 * ZEXT816(0x1000003d10);
      uVar157 = auVar3._0_8_;
      auVar136._8_8_ = 0;
      auVar136._0_8_ = uVar157 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar174;
      auVar109._8_8_ = 0;
      auVar109._0_8_ = uVar174;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar156;
      auVar110._8_8_ = 0;
      auVar110._0_8_ = uVar163;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar161 * 2;
      auVar111._8_8_ = 0;
      auVar111._0_8_ = uVar162;
      auVar3 = auVar12 * auVar110 + auVar136 + auVar13 * auVar111;
      uVar169 = auVar3._0_8_;
      auVar138._8_8_ = 0;
      auVar138._0_8_ = uVar169 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar112._8_8_ = 0;
      auVar112._0_8_ = (uVar169 & 0xfffffffffffff) << 4 | (uVar157 & 0xfffffffffffff) >> 0x30;
      auVar3 = auVar11 * auVar109 + ZEXT816(0x1000003d1) * auVar112;
      uVar169 = auVar3._0_8_;
      sStack_b8.n[0] = uVar169 & 0xfffffffffffff;
      auVar137._8_8_ = 0;
      auVar137._0_8_ = uVar169 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar174 * 2;
      auVar113._8_8_ = 0;
      auVar113._0_8_ = uVar156;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar161;
      auVar114._8_8_ = 0;
      auVar114._0_8_ = uVar163;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar162;
      auVar115._8_8_ = 0;
      auVar115._0_8_ = uVar162;
      auVar4 = auVar15 * auVar114 + auVar138 + auVar16 * auVar115;
      uVar169 = auVar4._0_8_;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar169 & 0xfffffffffffff;
      auVar3 = auVar14 * auVar113 + auVar137 + auVar17 * ZEXT816(0x1000003d10);
      uVar175 = auVar3._0_8_;
      auVar140._8_8_ = 0;
      auVar140._0_8_ = uVar169 >> 0x34 | auVar4._8_8_ << 0xc;
      sStack_b8.n[1] = uVar175 & 0xfffffffffffff;
      auVar139._8_8_ = 0;
      auVar139._0_8_ = uVar175 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar174 * 2;
      auVar116._8_8_ = 0;
      auVar116._0_8_ = uVar161;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar156;
      auVar117._8_8_ = 0;
      auVar117._0_8_ = uVar156;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar162;
      auVar118._8_8_ = 0;
      auVar118._0_8_ = uVar163;
      auVar140 = auVar20 * auVar118 + auVar140;
      uVar174 = auVar140._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar174 & 0xfffffffffffff;
      auVar3 = auVar18 * auVar116 + auVar139 + auVar19 * auVar117 + auVar21 * ZEXT816(0x1000003d10);
      uVar156 = auVar3._0_8_;
      sStack_b8.n[2] = uVar156 & 0xfffffffffffff;
      auVar141._8_8_ = 0;
      auVar141._0_8_ = (uVar156 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar168 & 0xfffffffffffff);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar174 >> 0x34 | auVar140._8_8_ << 0xc;
      auVar141 = auVar22 * ZEXT816(0x1000003d10) + auVar141;
      uVar174 = auVar141._0_8_;
      sStack_b8.n[3] = uVar174 & 0xfffffffffffff;
      sStack_b8.n[4] = (uVar174 >> 0x34 | auVar141._8_8_ << 0xc) + (uVar157 & 0xffffffffffff);
      sStack_b8.magnitude = 1;
      sStack_b8.normalized = 0;
      secp256k1_fe_verify(&sStack_b8);
      secp256k1_fe_mul(r,r,&sStack_b8);
      r_00 = &((secp256k1_gej *)r)->y;
      secp256k1_fe_mul(r_00,r_00,&sStack_b8);
      secp256k1_fe_mul(r_00,r_00,a);
      secp256k1_fe_mul(&((secp256k1_gej *)r)->z,&((secp256k1_gej *)r)->z,a);
      secp256k1_gej_verify((secp256k1_gej *)r);
      return;
    }
    secp256k1_gej_rescale_cold_2();
  }
  secp256k1_gej_rescale_cold_1();
  uVar174 = (ulong)psVar171 & 0xffffffff;
  psVar160 = psVar171;
  psVar172 = psVar173;
  secp256k1_fe_verify(&psVar173->x);
  if ((uint)psVar171 < 0x21) {
    iVar153 = (psVar173->x).magnitude * (uint)psVar171;
    if (iVar153 < 0x21) {
      (psVar173->x).n[0] = (psVar173->x).n[0] * uVar174;
      (psVar173->x).n[1] = (psVar173->x).n[1] * uVar174;
      (psVar173->x).n[2] = (psVar173->x).n[2] * uVar174;
      (psVar173->x).n[3] = (psVar173->x).n[3] * uVar174;
      (psVar173->x).n[4] = uVar174 * (psVar173->x).n[4];
      (psVar173->x).magnitude = iVar153;
      (psVar173->x).normalized = 0;
      secp256k1_fe_verify(&psVar173->x);
      return;
    }
  }
  else {
    secp256k1_fe_mul_int_unchecked_cold_2();
  }
  secp256k1_fe_mul_int_unchecked_cold_1();
  psVar171 = psVar172;
  secp256k1_fe_verify(&psVar172->x);
  iVar153 = (psVar172->x).magnitude;
  if (iVar153 < 0x20) {
    psVar171 = (secp256k1_ge *)(psVar172->x).n[0];
    uVar174 = -(ulong)((uint)psVar171 & 1);
    uVar156 = uVar174 >> 0xc;
    psVar160 = (secp256k1_ge *)((long)(psVar171->x).n + (uVar156 & 0xffffefffffc2f));
    if (((ulong)psVar160 & 1) == 0) {
      uVar161 = (uVar174 >> 0x10) + (psVar172->x).n[4];
      uVar162 = uVar156 + (psVar172->x).n[3];
      uVar170 = (uint)(uVar174 >> 0x2c);
      auVar185._0_8_ = CONCAT44(uVar170,(int)uVar156);
      auVar185._8_4_ = (int)uVar156;
      auVar185._12_4_ = uVar170;
      uVar174 = auVar185._0_8_ + (psVar172->x).n[1];
      uVar156 = auVar185._8_8_ + (psVar172->x).n[2];
      (psVar172->x).n[0] = ((ulong)((uint)uVar174 & 1) << 0x33) + ((ulong)psVar160 >> 1);
      (psVar172->x).n[1] = ((uVar156 & 1) << 0x33) + (uVar174 >> 1);
      (psVar172->x).n[2] = ((uVar162 & 1) << 0x33) + (uVar156 >> 1);
      (psVar172->x).n[3] = ((ulong)((uint)uVar161 & 1) << 0x33) + (uVar162 >> 1);
      (psVar172->x).n[4] = uVar161 >> 1;
      (psVar172->x).magnitude = (iVar153 >> 1) + 1;
      (psVar172->x).normalized = 0;
      secp256k1_fe_verify(&psVar172->x);
      return;
    }
  }
  else {
    secp256k1_fe_half_cold_2();
  }
  secp256k1_fe_half_cold_1();
  pcStack_1b0 = (code *)0x14a37d;
  psStack_130 = psVar172;
  psStack_128 = (secp256k1_ge *)a;
  secp256k1_fe_verify(&psVar160->x);
  uVar174 = (psVar160->x).n[4];
  lStack_1a0 = 0x1000003d1;
  uVar156 = (uVar174 >> 0x30) * 0x1000003d1 + (psVar160->x).n[0];
  uVar175 = (uVar156 >> 0x34) + (psVar160->x).n[1];
  uVar163 = (uVar175 >> 0x34) + (psVar160->x).n[2];
  uVar157 = (uVar163 >> 0x34) + (psVar160->x).n[3];
  uStack_198 = (uVar157 >> 0x34) + (uVar174 & 0xffffffffffff);
  psVar173 = (secp256k1_ge *)
             ((uVar156 ^ 0x1000003d0) & uVar175 & uVar163 & uVar157 & (uStack_198 ^ 0xf000000000000)
             );
  pcStack_1b0 = (code *)0x14a41a;
  secp256k1_fe_verify(&psVar160->x);
  sStack_168.n[0] = (psVar160->x).n[0];
  sStack_168.n[1] = (psVar160->x).n[1];
  sStack_168.n[2] = (psVar160->x).n[2];
  sStack_168.n[3] = (psVar160->x).n[3];
  sStack_168.n[4] = (psVar160->x).n[4];
  sStack_168.magnitude = (psVar160->x).magnitude;
  sStack_168.normalized = (psVar160->x).normalized;
  pcStack_1b0 = (code *)0x14a443;
  secp256k1_fe_normalize(&sStack_168);
  sStack_190.v[0] = (sStack_168.n[1] << 0x34 | sStack_168.n[0]) & 0x3fffffffffffffff;
  a_02 = &sStack_190;
  sStack_190.v[1] = (ulong)((uint)sStack_168.n[2] & 0xfffff) << 0x2a | sStack_168.n[1] >> 10;
  sStack_190.v[2] = (ulong)((uint)sStack_168.n[3] & 0x3fffffff) << 0x20 | sStack_168.n[2] >> 0x14;
  sStack_190.v[3] = (sStack_168.n[4] & 0xffffffffff) << 0x16 | sStack_168.n[3] >> 0x1e;
  sStack_190.v[4] = sStack_168.n[4] >> 0x28;
  pcStack_1b0 = (code *)0x14a4d5;
  secp256k1_modinv64(a_02,&secp256k1_const_modinfo_fe);
  pcStack_1b0 = (code *)0x14a4e0;
  secp256k1_fe_from_signed62(&psVar171->x,a_02);
  (psVar171->x).magnitude = (uint)(0 < (psVar160->x).magnitude);
  (psVar171->x).normalized = 1;
  pcStack_1b0 = (code *)0x14a4fc;
  secp256k1_fe_verify(&psVar171->x);
  uVar174 = (psVar171->x).n[4];
  a_00 = (secp256k1_ge *)(uVar174 & 0xffffffffffff);
  uVar162 = (uVar174 >> 0x30) * lStack_1a0 + (psVar171->x).n[0];
  uVar161 = (uVar162 >> 0x34) + (psVar171->x).n[1];
  uVar168 = (uVar161 >> 0x34) + (psVar171->x).n[2];
  uVar169 = (uVar168 >> 0x34) + (psVar171->x).n[3];
  psVar172 = (secp256k1_ge *)((long)(a_00->x).n + (uVar169 >> 0x34));
  uVar174 = (uVar162 ^ 0x1000003d0) & uVar161 & uVar168 & uVar169 &
            ((ulong)psVar172 ^ 0xf000000000000);
  uVar156 = (uVar175 | uVar156 | uVar163 | uVar157) & 0xfffffffffffff | uStack_198;
  if ((psVar173 != (secp256k1_ge *)0xfffffffffffff && uVar156 != 0) !=
      (uVar174 == 0xfffffffffffff ||
      ((uVar161 | uVar162 | uVar168 | uVar169) & 0xfffffffffffff) == 0 &&
      psVar172 == (secp256k1_ge *)0x0)) {
    secp256k1_fe_verify(&psVar171->x);
    return;
  }
  pcStack_1b0 = secp256k1_fe_from_signed62;
  secp256k1_fe_inv_cold_1();
  uVar161 = (psVar172->x).n[0];
  if (uVar161 >> 0x3e == 0) {
    uVar162 = (psVar172->x).n[1];
    if (0x3fffffffffffffff < uVar162) goto LAB_0014a683;
    uVar163 = (psVar172->x).n[2];
    if (0x3fffffffffffffff < uVar163) goto LAB_0014a688;
    uVar157 = (psVar172->x).n[3];
    if (0x3fffffffffffffff < uVar157) goto LAB_0014a68d;
    uVar168 = (psVar172->x).n[4];
    if (uVar168 < 0x100) {
      (a_00->x).n[0] = uVar161 & 0xfffffffffffff;
      (a_00->x).n[1] = (uVar162 & 0x3ffffffffff) << 10 | uVar161 >> 0x34;
      (a_00->x).n[2] = (uVar163 & 0xffffffff) << 0x14 | uVar162 >> 0x2a;
      (a_00->x).n[3] = (ulong)((uint)uVar157 & 0x3fffff) << 0x1e | uVar163 >> 0x20;
      (a_00->x).n[4] = uVar168 << 0x28 | uVar157 >> 0x16;
      return;
    }
  }
  else {
    psStack_1b8 = (secp256k1_ge *)0x14a683;
    secp256k1_fe_from_signed62_cold_5();
LAB_0014a683:
    psStack_1b8 = (secp256k1_ge *)0x14a688;
    secp256k1_fe_from_signed62_cold_4();
LAB_0014a688:
    psStack_1b8 = (secp256k1_ge *)0x14a68d;
    secp256k1_fe_from_signed62_cold_3();
LAB_0014a68d:
    psStack_1b8 = (secp256k1_ge *)0x14a692;
    secp256k1_fe_from_signed62_cold_2();
  }
  psStack_1b8 = (secp256k1_ge *)secp256k1_scalar_split_lambda;
  secp256k1_fe_from_signed62_cold_1();
  psStack_1e0 = psVar171;
  uStack_1d8 = uVar174;
  uStack_1d0 = uVar156;
  psStack_1c8 = psVar160;
  psStack_1c0 = a_02;
  psStack_1b8 = psVar173;
  if (a_00 == extraout_RDX) {
    psStack_2d0 = (secp256k1_ge *)0x14b108;
    secp256k1_scalar_split_lambda_cold_6();
LAB_0014b108:
    psStack_2d0 = (secp256k1_ge *)0x14b10d;
    secp256k1_scalar_split_lambda_cold_5();
LAB_0014b10d:
    psStack_2d0 = (secp256k1_ge *)0x14b112;
    secp256k1_scalar_split_lambda_cold_4();
LAB_0014b112:
    psStack_2d0 = (secp256k1_ge *)0x14b117;
    secp256k1_scalar_split_lambda_cold_3();
LAB_0014b117:
    a_01 = psVar160;
    psStack_2d0 = (secp256k1_ge *)0x14b11c;
    secp256k1_scalar_split_lambda_cold_1();
  }
  else {
    if (psVar172 == extraout_RDX) goto LAB_0014b108;
    if (a_00 == psVar172) goto LAB_0014b10d;
    uVar174 = (extraout_RDX->x).n[0];
    uVar156 = (extraout_RDX->x).n[1];
    uVar161 = (extraout_RDX->x).n[2];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar174;
    uVar157 = SUB168(auVar23 * ZEXT816(0xe893209a45dbb031),8);
    auVar147._8_8_ = 0;
    auVar147._0_8_ = uVar157;
    auStack_2a8._32_8_ = SUB168(auVar23 * ZEXT816(0xe893209a45dbb031),0);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar174;
    auVar24 = auVar24 * ZEXT816(0x3daa8a1471e8ca7f);
    uVar163 = SUB168(auVar24 + auVar147,0);
    uVar169 = SUB168(auVar24 + auVar147,8);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar156;
    uVar168 = SUB168(auVar25 * ZEXT816(0xe893209a45dbb031),8);
    uVar162 = SUB168(auVar25 * ZEXT816(0xe893209a45dbb031),0);
    auStack_2a8._40_8_ = uVar163 + uVar162;
    uVar162 = (ulong)CARRY8(uVar163,uVar162);
    uVar163 = uVar169 + uVar168;
    uVar175 = uVar163 + uVar162;
    uVar180 = (ulong)CARRY8(auVar24._8_8_,(ulong)CARRY8(uVar157,auVar24._0_8_)) +
              (ulong)(CARRY8(uVar169,uVar168) || CARRY8(uVar163,uVar162));
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar174;
    uVar164 = SUB168(auVar26 * ZEXT816(0xe86c90e49284eb15),8);
    uVar162 = SUB168(auVar26 * ZEXT816(0xe86c90e49284eb15),0);
    uVar157 = uVar175 + uVar162;
    uVar162 = (ulong)CARRY8(uVar175,uVar162);
    uVar168 = uVar180 + uVar164;
    uVar181 = uVar168 + uVar162;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar156;
    uVar165 = SUB168(auVar27 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar163 = SUB168(auVar27 * ZEXT816(0x3daa8a1471e8ca7f),0);
    uVar175 = uVar157 + uVar163;
    uVar163 = (ulong)CARRY8(uVar157,uVar163);
    uVar169 = uVar181 + uVar165;
    uVar182 = uVar169 + uVar163;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar161;
    uVar166 = SUB168(auVar28 * ZEXT816(0xe893209a45dbb031),8);
    uVar157 = SUB168(auVar28 * ZEXT816(0xe893209a45dbb031),0);
    auStack_2a8._48_8_ = uVar175 + uVar157;
    uVar157 = (ulong)CARRY8(uVar175,uVar157);
    uVar175 = uVar182 + uVar166;
    uVar183 = uVar175 + uVar157;
    uVar176 = (ulong)(CARRY8(uVar180,uVar164) || CARRY8(uVar168,uVar162)) +
              (ulong)(CARRY8(uVar181,uVar165) || CARRY8(uVar169,uVar163)) +
              (ulong)(CARRY8(uVar182,uVar166) || CARRY8(uVar175,uVar157));
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar174;
    uVar166 = SUB168(auVar29 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar174 = SUB168(auVar29 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar157 = uVar183 + uVar174;
    uVar162 = (ulong)CARRY8(uVar183,uVar174);
    uVar169 = uVar176 + uVar166;
    uVar183 = uVar169 + uVar162;
    uVar174 = (extraout_RDX->x).n[3];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar156;
    uVar180 = SUB168(auVar30 * ZEXT816(0xe86c90e49284eb15),8);
    uVar163 = SUB168(auVar30 * ZEXT816(0xe86c90e49284eb15),0);
    uVar168 = uVar157 + uVar163;
    uVar163 = (ulong)CARRY8(uVar157,uVar163);
    uVar175 = uVar183 + uVar180;
    uVar177 = uVar175 + uVar163;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar161;
    uVar181 = SUB168(auVar31 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar157 = SUB168(auVar31 * ZEXT816(0x3daa8a1471e8ca7f),0);
    uVar165 = uVar168 + uVar157;
    uVar157 = (ulong)CARRY8(uVar168,uVar157);
    uVar164 = uVar177 + uVar181;
    uVar178 = uVar164 + uVar157;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar174;
    uVar182 = SUB168(auVar32 * ZEXT816(0xe893209a45dbb031),8);
    uVar168 = SUB168(auVar32 * ZEXT816(0xe893209a45dbb031),0);
    auStack_2a8._56_8_ = uVar165 + uVar168;
    uVar168 = (ulong)CARRY8(uVar165,uVar168);
    uVar165 = uVar178 + uVar182;
    uVar179 = uVar165 + uVar168;
    uVar166 = (ulong)(CARRY8(uVar176,uVar166) || CARRY8(uVar169,uVar162)) +
              (ulong)(CARRY8(uVar183,uVar180) || CARRY8(uVar175,uVar163)) +
              (ulong)(CARRY8(uVar177,uVar181) || CARRY8(uVar164,uVar157)) +
              (ulong)(CARRY8(uVar178,uVar182) || CARRY8(uVar165,uVar168));
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar156;
    uVar175 = SUB168(auVar33 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar156 = SUB168(auVar33 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar163 = uVar179 + uVar156;
    uVar156 = (ulong)CARRY8(uVar179,uVar156);
    uVar157 = uVar166 + uVar175;
    uVar180 = uVar157 + uVar156;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar161;
    uVar164 = SUB168(auVar34 * ZEXT816(0xe86c90e49284eb15),8);
    uVar162 = SUB168(auVar34 * ZEXT816(0xe86c90e49284eb15),0);
    uVar169 = uVar163 + uVar162;
    uVar162 = (ulong)CARRY8(uVar163,uVar162);
    uVar168 = uVar180 + uVar164;
    uVar181 = uVar168 + uVar162;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar174;
    uVar165 = SUB168(auVar35 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar163 = SUB168(auVar35 * ZEXT816(0x3daa8a1471e8ca7f),0);
    auStack_2a8._64_8_ = uVar169 + uVar163;
    uVar163 = (ulong)CARRY8(uVar169,uVar163);
    uVar169 = uVar181 + uVar165;
    uVar182 = uVar169 + uVar163;
    uVar169 = (ulong)(CARRY8(uVar166,uVar175) || CARRY8(uVar157,uVar156)) +
              (ulong)(CARRY8(uVar180,uVar164) || CARRY8(uVar168,uVar162)) +
              (ulong)(CARRY8(uVar181,uVar165) || CARRY8(uVar169,uVar163));
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar161;
    uVar157 = SUB168(auVar36 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar156 = SUB168(auVar36 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar163 = uVar182 + uVar156;
    uVar156 = (ulong)CARRY8(uVar182,uVar156);
    uVar162 = uVar169 + uVar157;
    uVar175 = uVar162 + uVar156;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar174;
    uVar168 = SUB168(auVar37 * ZEXT816(0xe86c90e49284eb15),8);
    uVar161 = SUB168(auVar37 * ZEXT816(0xe86c90e49284eb15),0);
    auStack_2a8._72_8_ = uVar163 + uVar161;
    uVar161 = (ulong)CARRY8(uVar163,uVar161);
    uVar163 = uVar175 + uVar168;
    auStack_2a8._88_8_ =
         (ulong)(CARRY8(uVar169,uVar157) || CARRY8(uVar162,uVar156)) +
         (ulong)(CARRY8(uVar175,uVar168) || CARRY8(uVar163,uVar161));
    auStack_2a8._80_8_ = uVar163 + uVar161;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar174;
    auStack_2a8._80_16_ = auVar38 * ZEXT816(0x3086d221a7d46bcd) + auStack_2a8._80_16_;
    uStack_238 = 0;
    uStack_230 = 0;
    psStack_2d0 = (secp256k1_ge *)0x14a853;
    psStack_2c0 = a_00;
    psStack_2b8 = extraout_RDX;
    psStack_2b0 = psVar172;
    auStack_248 = auStack_2a8._80_16_;
    secp256k1_scalar_cadd_bit
              ((secp256k1_scalar *)auStack_248,0,(uint)((ulong)auStack_2a8._72_8_ >> 0x3f));
    uVar174 = (psStack_2b8->x).n[0];
    uVar156 = (psStack_2b8->x).n[1];
    uVar161 = (psStack_2b8->x).n[2];
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar174;
    uVar157 = SUB168(auVar39 * ZEXT816(0x1571b4ae8ac47f71),8);
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar157;
    auStack_2a8._32_8_ = SUB168(auVar39 * ZEXT816(0x1571b4ae8ac47f71),0);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar174;
    auVar40 = auVar40 * ZEXT816(0x221208ac9df506c6);
    uVar163 = SUB168(auVar40 + auVar148,0);
    uVar169 = SUB168(auVar40 + auVar148,8);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar156;
    uVar168 = SUB168(auVar41 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar162 = SUB168(auVar41 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_2a8._40_8_ = uVar163 + uVar162;
    uVar162 = (ulong)CARRY8(uVar163,uVar162);
    uVar163 = uVar169 + uVar168;
    uVar175 = uVar163 + uVar162;
    uVar180 = (ulong)CARRY8(auVar40._8_8_,(ulong)CARRY8(uVar157,auVar40._0_8_)) +
              (ulong)(CARRY8(uVar169,uVar168) || CARRY8(uVar163,uVar162));
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar174;
    uVar164 = SUB168(auVar42 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar162 = SUB168(auVar42 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar157 = uVar175 + uVar162;
    uVar162 = (ulong)CARRY8(uVar175,uVar162);
    uVar168 = uVar180 + uVar164;
    uVar181 = uVar168 + uVar162;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar156;
    uVar165 = SUB168(auVar43 * ZEXT816(0x221208ac9df506c6),8);
    uVar163 = SUB168(auVar43 * ZEXT816(0x221208ac9df506c6),0);
    uVar175 = uVar157 + uVar163;
    uVar163 = (ulong)CARRY8(uVar157,uVar163);
    uVar169 = uVar181 + uVar165;
    uVar182 = uVar169 + uVar163;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar161;
    uVar166 = SUB168(auVar44 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar157 = SUB168(auVar44 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_2a8._48_8_ = uVar175 + uVar157;
    uVar157 = (ulong)CARRY8(uVar175,uVar157);
    uVar175 = uVar182 + uVar166;
    uVar183 = uVar175 + uVar157;
    uVar176 = (ulong)(CARRY8(uVar180,uVar164) || CARRY8(uVar168,uVar162)) +
              (ulong)(CARRY8(uVar181,uVar165) || CARRY8(uVar169,uVar163)) +
              (ulong)(CARRY8(uVar182,uVar166) || CARRY8(uVar175,uVar157));
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar174;
    uVar166 = SUB168(auVar45 * ZEXT816(0xe4437ed6010e8828),8);
    uVar174 = SUB168(auVar45 * ZEXT816(0xe4437ed6010e8828),0);
    uVar157 = uVar183 + uVar174;
    uVar162 = (ulong)CARRY8(uVar183,uVar174);
    uVar169 = uVar176 + uVar166;
    uVar183 = uVar169 + uVar162;
    uVar174 = (psStack_2b8->x).n[3];
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar156;
    uVar180 = SUB168(auVar46 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar163 = SUB168(auVar46 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar168 = uVar157 + uVar163;
    uVar163 = (ulong)CARRY8(uVar157,uVar163);
    uVar175 = uVar183 + uVar180;
    uVar177 = uVar175 + uVar163;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar161;
    uVar181 = SUB168(auVar47 * ZEXT816(0x221208ac9df506c6),8);
    uVar157 = SUB168(auVar47 * ZEXT816(0x221208ac9df506c6),0);
    uVar165 = uVar168 + uVar157;
    uVar157 = (ulong)CARRY8(uVar168,uVar157);
    uVar164 = uVar177 + uVar181;
    uVar178 = uVar164 + uVar157;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar174;
    uVar182 = SUB168(auVar48 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar168 = SUB168(auVar48 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_2a8._56_8_ = uVar165 + uVar168;
    uVar168 = (ulong)CARRY8(uVar165,uVar168);
    uVar165 = uVar178 + uVar182;
    uVar179 = uVar165 + uVar168;
    uVar166 = (ulong)(CARRY8(uVar176,uVar166) || CARRY8(uVar169,uVar162)) +
              (ulong)(CARRY8(uVar183,uVar180) || CARRY8(uVar175,uVar163)) +
              (ulong)(CARRY8(uVar177,uVar181) || CARRY8(uVar164,uVar157)) +
              (ulong)(CARRY8(uVar178,uVar182) || CARRY8(uVar165,uVar168));
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar156;
    uVar175 = SUB168(auVar49 * ZEXT816(0xe4437ed6010e8828),8);
    uVar156 = SUB168(auVar49 * ZEXT816(0xe4437ed6010e8828),0);
    uVar163 = uVar179 + uVar156;
    uVar156 = (ulong)CARRY8(uVar179,uVar156);
    uVar157 = uVar166 + uVar175;
    uVar180 = uVar157 + uVar156;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar161;
    uVar164 = SUB168(auVar50 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar162 = SUB168(auVar50 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar169 = uVar163 + uVar162;
    uVar162 = (ulong)CARRY8(uVar163,uVar162);
    uVar168 = uVar180 + uVar164;
    uVar181 = uVar168 + uVar162;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar174;
    uVar165 = SUB168(auVar51 * ZEXT816(0x221208ac9df506c6),8);
    uVar163 = SUB168(auVar51 * ZEXT816(0x221208ac9df506c6),0);
    auStack_2a8._64_8_ = uVar169 + uVar163;
    uVar163 = (ulong)CARRY8(uVar169,uVar163);
    uVar169 = uVar181 + uVar165;
    uVar182 = uVar169 + uVar163;
    uVar169 = (ulong)(CARRY8(uVar166,uVar175) || CARRY8(uVar157,uVar156)) +
              (ulong)(CARRY8(uVar180,uVar164) || CARRY8(uVar168,uVar162)) +
              (ulong)(CARRY8(uVar181,uVar165) || CARRY8(uVar169,uVar163));
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar161;
    uVar157 = SUB168(auVar52 * ZEXT816(0xe4437ed6010e8828),8);
    uVar156 = SUB168(auVar52 * ZEXT816(0xe4437ed6010e8828),0);
    uVar163 = uVar182 + uVar156;
    uVar156 = (ulong)CARRY8(uVar182,uVar156);
    uVar162 = uVar169 + uVar157;
    uVar175 = uVar162 + uVar156;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar174;
    uVar168 = SUB168(auVar53 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar161 = SUB168(auVar53 * ZEXT816(0x6f547fa90abfe4c4),0);
    auStack_2a8._72_8_ = uVar163 + uVar161;
    uVar161 = (ulong)CARRY8(uVar163,uVar161);
    uVar163 = uVar175 + uVar168;
    auVar142._8_8_ =
         (ulong)(CARRY8(uVar169,uVar157) || CARRY8(uVar162,uVar156)) +
         (ulong)(CARRY8(uVar175,uVar168) || CARRY8(uVar163,uVar161));
    auVar142._0_8_ = uVar163 + uVar161;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar174;
    auStack_2a8._80_16_ = auVar54 * ZEXT816(0xe4437ed6010e8828) + auVar142;
    uStack_1f8 = 0;
    uStack_1f0 = 0;
    psStack_2d0 = (secp256k1_ge *)0x14a9d1;
    auStack_208 = auStack_2a8._80_16_;
    secp256k1_scalar_cadd_bit
              ((secp256k1_scalar *)auStack_208,0,(uint)((ulong)auStack_2a8._72_8_ >> 0x3f));
    auVar55._8_8_ = 0;
    auVar55._0_8_ = auStack_248._0_8_;
    uVar161 = SUB168(auVar55 * ZEXT816(0x6f547fa90abfe4c3),8);
    auVar149._8_8_ = 0;
    auVar149._0_8_ = uVar161;
    auStack_2a8._32_8_ = SUB168(auVar55 * ZEXT816(0x6f547fa90abfe4c3),0);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = auStack_248._0_8_;
    auVar56 = auVar56 * ZEXT816(0xe4437ed6010e8828);
    uVar156 = SUB168(auVar56 + auVar149,0);
    uVar163 = SUB168(auVar56 + auVar149,8);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = auStack_248._8_8_;
    uVar162 = SUB168(auVar57 * ZEXT816(0x6f547fa90abfe4c3),8);
    uVar174 = SUB168(auVar57 * ZEXT816(0x6f547fa90abfe4c3),0);
    auStack_2a8._40_8_ = uVar156 + uVar174;
    uVar174 = (ulong)CARRY8(uVar156,uVar174);
    uVar156 = uVar163 + uVar162;
    uVar157 = uVar156 + uVar174;
    uVar164 = (ulong)CARRY8(auVar56._8_8_,(ulong)CARRY8(uVar161,auVar56._0_8_)) +
              (ulong)(CARRY8(uVar163,uVar162) || CARRY8(uVar156,uVar174));
    auVar58._8_8_ = 0;
    auVar58._0_8_ = auStack_248._0_8_;
    uVar168 = SUB168(auVar58 * ZEXT816(0),8);
    uVar174 = SUB168(auVar58 * ZEXT816(0),0);
    uVar161 = uVar157 + uVar174;
    uVar174 = (ulong)CARRY8(uVar157,uVar174);
    uVar162 = uVar164 + uVar168;
    uVar165 = uVar162 + uVar174;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = auStack_248._8_8_;
    uVar169 = SUB168(auVar59 * ZEXT816(0xe4437ed6010e8828),8);
    uVar156 = SUB168(auVar59 * ZEXT816(0xe4437ed6010e8828),0);
    uVar157 = uVar161 + uVar156;
    uVar156 = (ulong)CARRY8(uVar161,uVar156);
    uVar163 = uVar165 + uVar169;
    uVar166 = uVar163 + uVar156;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uStack_238;
    uVar175 = SUB168(auVar60 * ZEXT816(0x6f547fa90abfe4c3),8);
    uVar161 = SUB168(auVar60 * ZEXT816(0x6f547fa90abfe4c3),0);
    auStack_2a8._48_8_ = uVar157 + uVar161;
    uVar161 = (ulong)CARRY8(uVar157,uVar161);
    uVar157 = uVar166 + uVar175;
    uVar181 = uVar157 + uVar161;
    uVar180 = (ulong)(CARRY8(uVar164,uVar168) || CARRY8(uVar162,uVar174)) +
              (ulong)(CARRY8(uVar165,uVar169) || CARRY8(uVar163,uVar156)) +
              (ulong)(CARRY8(uVar166,uVar175) || CARRY8(uVar157,uVar161));
    auVar61._8_8_ = 0;
    auVar61._0_8_ = auStack_248._0_8_;
    uVar175 = SUB168(auVar61 * ZEXT816(0),8);
    uVar174 = SUB168(auVar61 * ZEXT816(0),0);
    uVar161 = uVar181 + uVar174;
    uVar174 = (ulong)CARRY8(uVar181,uVar174);
    uVar163 = uVar180 + uVar175;
    uVar181 = uVar163 + uVar174;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = auStack_248._8_8_;
    uVar164 = SUB168(auVar62 * ZEXT816(0),8);
    uVar156 = SUB168(auVar62 * ZEXT816(0),0);
    uVar162 = uVar161 + uVar156;
    uVar156 = (ulong)CARRY8(uVar161,uVar156);
    uVar157 = uVar181 + uVar164;
    uVar182 = uVar157 + uVar156;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uStack_238;
    uVar165 = SUB168(auVar63 * ZEXT816(0xe4437ed6010e8828),8);
    uVar161 = SUB168(auVar63 * ZEXT816(0xe4437ed6010e8828),0);
    uVar169 = uVar162 + uVar161;
    uVar161 = (ulong)CARRY8(uVar162,uVar161);
    uVar168 = uVar182 + uVar165;
    uVar176 = uVar168 + uVar161;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uStack_230;
    uVar166 = SUB168(auVar64 * ZEXT816(0x6f547fa90abfe4c3),8);
    uVar162 = SUB168(auVar64 * ZEXT816(0x6f547fa90abfe4c3),0);
    auStack_2a8._56_8_ = uVar169 + uVar162;
    uVar162 = (ulong)CARRY8(uVar169,uVar162);
    uVar169 = uVar176 + uVar166;
    uVar183 = uVar169 + uVar162;
    uVar164 = (ulong)(CARRY8(uVar180,uVar175) || CARRY8(uVar163,uVar174)) +
              (ulong)(CARRY8(uVar181,uVar164) || CARRY8(uVar157,uVar156)) +
              (ulong)(CARRY8(uVar182,uVar165) || CARRY8(uVar168,uVar161)) +
              (ulong)(CARRY8(uVar176,uVar166) || CARRY8(uVar169,uVar162));
    auVar65._8_8_ = 0;
    auVar65._0_8_ = auStack_248._8_8_;
    uVar168 = SUB168(auVar65 * ZEXT816(0),8);
    uVar174 = SUB168(auVar65 * ZEXT816(0),0);
    uVar161 = uVar183 + uVar174;
    uVar174 = (ulong)CARRY8(uVar183,uVar174);
    uVar162 = uVar164 + uVar168;
    uVar165 = uVar162 + uVar174;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uStack_238;
    uVar169 = SUB168(auVar66 * ZEXT816(0),8);
    uVar156 = SUB168(auVar66 * ZEXT816(0),0);
    uVar157 = uVar161 + uVar156;
    uVar156 = (ulong)CARRY8(uVar161,uVar156);
    uVar163 = uVar165 + uVar169;
    uVar166 = uVar163 + uVar156;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uStack_230;
    uVar175 = SUB168(auVar67 * ZEXT816(0xe4437ed6010e8828),8);
    uVar161 = SUB168(auVar67 * ZEXT816(0xe4437ed6010e8828),0);
    auStack_2a8._64_8_ = uVar157 + uVar161;
    uVar161 = (ulong)CARRY8(uVar157,uVar161);
    uVar157 = uVar166 + uVar175;
    uVar180 = uVar157 + uVar161;
    uVar168 = (ulong)(CARRY8(uVar164,uVar168) || CARRY8(uVar162,uVar174)) +
              (ulong)(CARRY8(uVar165,uVar169) || CARRY8(uVar163,uVar156)) +
              (ulong)(CARRY8(uVar166,uVar175) || CARRY8(uVar157,uVar161));
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uStack_238;
    uVar163 = SUB168(auVar68 * ZEXT816(0),8);
    uVar174 = SUB168(auVar68 * ZEXT816(0),0);
    uVar162 = uVar180 + uVar174;
    uVar174 = (ulong)CARRY8(uVar180,uVar174);
    uVar161 = uVar168 + uVar163;
    uVar169 = uVar161 + uVar174;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uStack_230;
    uVar157 = SUB168(auVar69 * ZEXT816(0),8);
    uVar156 = SUB168(auVar69 * ZEXT816(0),0);
    auStack_2a8._72_8_ = uVar162 + uVar156;
    uVar156 = (ulong)CARRY8(uVar162,uVar156);
    uVar162 = uVar169 + uVar157;
    auVar143._8_8_ =
         (ulong)(CARRY8(uVar168,uVar163) || CARRY8(uVar161,uVar174)) +
         (ulong)(CARRY8(uVar169,uVar157) || CARRY8(uVar162,uVar156));
    auVar143._0_8_ = uVar162 + uVar156;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uStack_230;
    auStack_2a8._80_16_ = auVar70 * ZEXT816(0) + auVar143;
    psStack_2d0 = (secp256k1_ge *)0x14ab2e;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)auStack_248,(uint64_t *)(auStack_2a8 + 0x20));
    auVar71._8_8_ = 0;
    auVar71._0_8_ = auStack_208._0_8_;
    uVar161 = SUB168(auVar71 * ZEXT816(0xd765cda83db1562c),8);
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uVar161;
    auStack_2a8._32_8_ = SUB168(auVar71 * ZEXT816(0xd765cda83db1562c),0);
    auVar72._8_8_ = 0;
    auVar72._0_8_ = auStack_208._0_8_;
    auVar72 = auVar72 * ZEXT816(0x8a280ac50774346d);
    uVar156 = SUB168(auVar72 + auVar150,0);
    uVar163 = SUB168(auVar72 + auVar150,8);
    auVar73._8_8_ = 0;
    auVar73._0_8_ = auStack_208._8_8_;
    uVar162 = SUB168(auVar73 * ZEXT816(0xd765cda83db1562c),8);
    uVar174 = SUB168(auVar73 * ZEXT816(0xd765cda83db1562c),0);
    auStack_2a8._40_8_ = uVar156 + uVar174;
    uVar174 = (ulong)CARRY8(uVar156,uVar174);
    uVar156 = uVar163 + uVar162;
    uVar157 = uVar156 + uVar174;
    uVar164 = (ulong)CARRY8(auVar72._8_8_,(ulong)CARRY8(uVar161,auVar72._0_8_)) +
              (ulong)(CARRY8(uVar163,uVar162) || CARRY8(uVar156,uVar174));
    auVar74._8_8_ = 0;
    auVar74._0_8_ = auStack_208._0_8_;
    uVar168 = SUB168(auVar74 * ZEXT816(0xfffffffffffffffe),8);
    uVar174 = SUB168(auVar74 * ZEXT816(0xfffffffffffffffe),0);
    uVar161 = uVar157 + uVar174;
    uVar174 = (ulong)CARRY8(uVar157,uVar174);
    uVar162 = uVar164 + uVar168;
    uVar165 = uVar162 + uVar174;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = auStack_208._8_8_;
    uVar169 = SUB168(auVar75 * ZEXT816(0x8a280ac50774346d),8);
    uVar156 = SUB168(auVar75 * ZEXT816(0x8a280ac50774346d),0);
    uVar157 = uVar161 + uVar156;
    uVar156 = (ulong)CARRY8(uVar161,uVar156);
    uVar163 = uVar165 + uVar169;
    uVar166 = uVar163 + uVar156;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uStack_1f8;
    uVar175 = SUB168(auVar76 * ZEXT816(0xd765cda83db1562c),8);
    uVar161 = SUB168(auVar76 * ZEXT816(0xd765cda83db1562c),0);
    auStack_2a8._48_8_ = uVar157 + uVar161;
    uVar161 = (ulong)CARRY8(uVar157,uVar161);
    uVar157 = uVar166 + uVar175;
    uVar181 = uVar157 + uVar161;
    uVar180 = (ulong)(CARRY8(uVar164,uVar168) || CARRY8(uVar162,uVar174)) +
              (ulong)(CARRY8(uVar165,uVar169) || CARRY8(uVar163,uVar156)) +
              (ulong)(CARRY8(uVar166,uVar175) || CARRY8(uVar157,uVar161));
    auVar77._8_8_ = 0;
    auVar77._0_8_ = auStack_208._0_8_;
    uVar175 = SUB168(auVar77 * ZEXT816(0xffffffffffffffff),8);
    uVar174 = SUB168(auVar77 * ZEXT816(0xffffffffffffffff),0);
    uVar161 = uVar181 + uVar174;
    uVar174 = (ulong)CARRY8(uVar181,uVar174);
    uVar163 = uVar180 + uVar175;
    uVar181 = uVar163 + uVar174;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = auStack_208._8_8_;
    uVar164 = SUB168(auVar78 * ZEXT816(0xfffffffffffffffe),8);
    uVar156 = SUB168(auVar78 * ZEXT816(0xfffffffffffffffe),0);
    uVar162 = uVar161 + uVar156;
    uVar156 = (ulong)CARRY8(uVar161,uVar156);
    uVar157 = uVar181 + uVar164;
    uVar182 = uVar157 + uVar156;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uStack_1f8;
    uVar165 = SUB168(auVar79 * ZEXT816(0x8a280ac50774346d),8);
    uVar161 = SUB168(auVar79 * ZEXT816(0x8a280ac50774346d),0);
    uVar169 = uVar162 + uVar161;
    uVar161 = (ulong)CARRY8(uVar162,uVar161);
    uVar168 = uVar182 + uVar165;
    uVar176 = uVar168 + uVar161;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uStack_1f0;
    uVar166 = SUB168(auVar80 * ZEXT816(0xd765cda83db1562c),8);
    uVar162 = SUB168(auVar80 * ZEXT816(0xd765cda83db1562c),0);
    auStack_2a8._56_8_ = uVar169 + uVar162;
    uVar162 = (ulong)CARRY8(uVar169,uVar162);
    uVar169 = uVar176 + uVar166;
    uVar183 = uVar169 + uVar162;
    uVar164 = (ulong)(CARRY8(uVar180,uVar175) || CARRY8(uVar163,uVar174)) +
              (ulong)(CARRY8(uVar181,uVar164) || CARRY8(uVar157,uVar156)) +
              (ulong)(CARRY8(uVar182,uVar165) || CARRY8(uVar168,uVar161)) +
              (ulong)(CARRY8(uVar176,uVar166) || CARRY8(uVar169,uVar162));
    auVar81._8_8_ = 0;
    auVar81._0_8_ = auStack_208._8_8_;
    uVar168 = SUB168(auVar81 * ZEXT816(0xffffffffffffffff),8);
    uVar174 = SUB168(auVar81 * ZEXT816(0xffffffffffffffff),0);
    uVar161 = uVar183 + uVar174;
    uVar174 = (ulong)CARRY8(uVar183,uVar174);
    uVar162 = uVar164 + uVar168;
    uVar165 = uVar162 + uVar174;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uStack_1f8;
    uVar169 = SUB168(auVar82 * ZEXT816(0xfffffffffffffffe),8);
    uVar156 = SUB168(auVar82 * ZEXT816(0xfffffffffffffffe),0);
    uVar157 = uVar161 + uVar156;
    uVar156 = (ulong)CARRY8(uVar161,uVar156);
    uVar163 = uVar165 + uVar169;
    uVar166 = uVar163 + uVar156;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uStack_1f0;
    uVar175 = SUB168(auVar83 * ZEXT816(0x8a280ac50774346d),8);
    uVar161 = SUB168(auVar83 * ZEXT816(0x8a280ac50774346d),0);
    auStack_2a8._64_8_ = uVar157 + uVar161;
    uVar161 = (ulong)CARRY8(uVar157,uVar161);
    uVar157 = uVar166 + uVar175;
    uVar180 = uVar157 + uVar161;
    uVar168 = (ulong)(CARRY8(uVar164,uVar168) || CARRY8(uVar162,uVar174)) +
              (ulong)(CARRY8(uVar165,uVar169) || CARRY8(uVar163,uVar156)) +
              (ulong)(CARRY8(uVar166,uVar175) || CARRY8(uVar157,uVar161));
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uStack_1f8;
    uVar163 = SUB168(auVar84 * ZEXT816(0xffffffffffffffff),8);
    uVar174 = SUB168(auVar84 * ZEXT816(0xffffffffffffffff),0);
    uVar162 = uVar180 + uVar174;
    uVar174 = (ulong)CARRY8(uVar180,uVar174);
    uVar161 = uVar168 + uVar163;
    uVar169 = uVar161 + uVar174;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uStack_1f0;
    uVar157 = SUB168(auVar85 * ZEXT816(0xfffffffffffffffe),8);
    uVar156 = SUB168(auVar85 * ZEXT816(0xfffffffffffffffe),0);
    auStack_2a8._72_8_ = uVar162 + uVar156;
    uVar156 = (ulong)CARRY8(uVar162,uVar156);
    uVar162 = uVar169 + uVar157;
    auVar144._8_8_ =
         (ulong)(CARRY8(uVar168,uVar163) || CARRY8(uVar161,uVar174)) +
         (ulong)(CARRY8(uVar169,uVar157) || CARRY8(uVar162,uVar156));
    auVar144._0_8_ = uVar162 + uVar156;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uStack_1f0;
    auStack_2a8._80_16_ = auVar86 * ZEXT816(0xffffffffffffffff) + auVar144;
    psStack_2d0 = (secp256k1_ge *)0x14ac86;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)auStack_208,(uint64_t *)(auStack_2a8 + 0x20));
    psVar173 = psStack_2b0;
    psStack_2d0 = (secp256k1_ge *)0x14ac9e;
    secp256k1_scalar_add
              ((secp256k1_scalar *)psStack_2b0,(secp256k1_scalar *)auStack_248,
               (secp256k1_scalar *)auStack_208);
    uVar174 = (psVar173->x).n[0];
    uVar156 = (psVar173->x).n[1];
    uVar161 = (psVar173->x).n[2];
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar174;
    uVar157 = SUB168(auVar87 * ZEXT816(0xdf02967c1b23bd72),8);
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar157;
    auStack_2a8._32_8_ = SUB168(auVar87 * ZEXT816(0xdf02967c1b23bd72),0);
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar174;
    auVar88 = auVar88 * ZEXT816(0x122e22ea20816678);
    uVar163 = SUB168(auVar88 + auVar151,0);
    uVar169 = SUB168(auVar88 + auVar151,8);
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar156;
    uVar168 = SUB168(auVar89 * ZEXT816(0xdf02967c1b23bd72),8);
    uVar162 = SUB168(auVar89 * ZEXT816(0xdf02967c1b23bd72),0);
    auStack_2a8._40_8_ = uVar163 + uVar162;
    uVar162 = (ulong)CARRY8(uVar163,uVar162);
    uVar163 = uVar169 + uVar168;
    uVar175 = uVar163 + uVar162;
    uVar180 = (ulong)CARRY8(auVar88._8_8_,(ulong)CARRY8(uVar157,auVar88._0_8_)) +
              (ulong)(CARRY8(uVar169,uVar168) || CARRY8(uVar163,uVar162));
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar174;
    uVar164 = SUB168(auVar90 * ZEXT816(0xa5261c028812645a),8);
    uVar162 = SUB168(auVar90 * ZEXT816(0xa5261c028812645a),0);
    uVar157 = uVar175 + uVar162;
    uVar162 = (ulong)CARRY8(uVar175,uVar162);
    uVar168 = uVar180 + uVar164;
    uVar181 = uVar168 + uVar162;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = uVar156;
    uVar165 = SUB168(auVar91 * ZEXT816(0x122e22ea20816678),8);
    uVar163 = SUB168(auVar91 * ZEXT816(0x122e22ea20816678),0);
    uVar175 = uVar157 + uVar163;
    uVar163 = (ulong)CARRY8(uVar157,uVar163);
    uVar169 = uVar181 + uVar165;
    uVar182 = uVar169 + uVar163;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar161;
    uVar166 = SUB168(auVar92 * ZEXT816(0xdf02967c1b23bd72),8);
    uVar157 = SUB168(auVar92 * ZEXT816(0xdf02967c1b23bd72),0);
    auStack_2a8._48_8_ = uVar175 + uVar157;
    uVar157 = (ulong)CARRY8(uVar175,uVar157);
    uVar175 = uVar182 + uVar166;
    uVar183 = uVar175 + uVar157;
    uVar176 = (ulong)(CARRY8(uVar180,uVar164) || CARRY8(uVar168,uVar162)) +
              (ulong)(CARRY8(uVar181,uVar165) || CARRY8(uVar169,uVar163)) +
              (ulong)(CARRY8(uVar182,uVar166) || CARRY8(uVar175,uVar157));
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar174;
    uVar166 = SUB168(auVar93 * ZEXT816(0x5363ad4cc05c30e0),8);
    uVar174 = SUB168(auVar93 * ZEXT816(0x5363ad4cc05c30e0),0);
    uVar157 = uVar183 + uVar174;
    uVar162 = (ulong)CARRY8(uVar183,uVar174);
    uVar169 = uVar176 + uVar166;
    uVar183 = uVar169 + uVar162;
    uVar174 = (psVar173->x).n[3];
    auVar94._8_8_ = 0;
    auVar94._0_8_ = uVar156;
    uVar180 = SUB168(auVar94 * ZEXT816(0xa5261c028812645a),8);
    uVar163 = SUB168(auVar94 * ZEXT816(0xa5261c028812645a),0);
    uVar168 = uVar157 + uVar163;
    uVar163 = (ulong)CARRY8(uVar157,uVar163);
    uVar175 = uVar183 + uVar180;
    uVar177 = uVar175 + uVar163;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar161;
    uVar181 = SUB168(auVar95 * ZEXT816(0x122e22ea20816678),8);
    uVar157 = SUB168(auVar95 * ZEXT816(0x122e22ea20816678),0);
    uVar165 = uVar168 + uVar157;
    uVar157 = (ulong)CARRY8(uVar168,uVar157);
    uVar164 = uVar177 + uVar181;
    uVar178 = uVar164 + uVar157;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar174;
    uVar182 = SUB168(auVar96 * ZEXT816(0xdf02967c1b23bd72),8);
    uVar168 = SUB168(auVar96 * ZEXT816(0xdf02967c1b23bd72),0);
    auStack_2a8._56_8_ = uVar165 + uVar168;
    uVar168 = (ulong)CARRY8(uVar165,uVar168);
    uVar165 = uVar178 + uVar182;
    uVar179 = uVar165 + uVar168;
    uVar166 = (ulong)(CARRY8(uVar176,uVar166) || CARRY8(uVar169,uVar162)) +
              (ulong)(CARRY8(uVar183,uVar180) || CARRY8(uVar175,uVar163)) +
              (ulong)(CARRY8(uVar177,uVar181) || CARRY8(uVar164,uVar157)) +
              (ulong)(CARRY8(uVar178,uVar182) || CARRY8(uVar165,uVar168));
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar156;
    uVar175 = SUB168(auVar97 * ZEXT816(0x5363ad4cc05c30e0),8);
    uVar156 = SUB168(auVar97 * ZEXT816(0x5363ad4cc05c30e0),0);
    uVar163 = uVar179 + uVar156;
    uVar156 = (ulong)CARRY8(uVar179,uVar156);
    uVar157 = uVar166 + uVar175;
    uVar180 = uVar157 + uVar156;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar161;
    uVar164 = SUB168(auVar98 * ZEXT816(0xa5261c028812645a),8);
    uVar162 = SUB168(auVar98 * ZEXT816(0xa5261c028812645a),0);
    uVar169 = uVar163 + uVar162;
    uVar162 = (ulong)CARRY8(uVar163,uVar162);
    uVar168 = uVar180 + uVar164;
    uVar181 = uVar168 + uVar162;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar174;
    uVar165 = SUB168(auVar99 * ZEXT816(0x122e22ea20816678),8);
    uVar163 = SUB168(auVar99 * ZEXT816(0x122e22ea20816678),0);
    auStack_2a8._64_8_ = uVar169 + uVar163;
    uVar163 = (ulong)CARRY8(uVar169,uVar163);
    uVar169 = uVar181 + uVar165;
    uVar182 = uVar169 + uVar163;
    uVar169 = (ulong)(CARRY8(uVar166,uVar175) || CARRY8(uVar157,uVar156)) +
              (ulong)(CARRY8(uVar180,uVar164) || CARRY8(uVar168,uVar162)) +
              (ulong)(CARRY8(uVar181,uVar165) || CARRY8(uVar169,uVar163));
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar161;
    uVar157 = SUB168(auVar100 * ZEXT816(0x5363ad4cc05c30e0),8);
    uVar156 = SUB168(auVar100 * ZEXT816(0x5363ad4cc05c30e0),0);
    uVar163 = uVar182 + uVar156;
    uVar156 = (ulong)CARRY8(uVar182,uVar156);
    uVar162 = uVar169 + uVar157;
    uVar175 = uVar162 + uVar156;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar174;
    uVar168 = SUB168(auVar101 * ZEXT816(0xa5261c028812645a),8);
    uVar161 = SUB168(auVar101 * ZEXT816(0xa5261c028812645a),0);
    auStack_2a8._72_8_ = uVar163 + uVar161;
    uVar161 = (ulong)CARRY8(uVar163,uVar161);
    uVar163 = uVar175 + uVar168;
    auVar145._8_8_ =
         (ulong)(CARRY8(uVar169,uVar157) || CARRY8(uVar162,uVar156)) +
         (ulong)(CARRY8(uVar175,uVar168) || CARRY8(uVar163,uVar161));
    auVar145._0_8_ = uVar163 + uVar161;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar174;
    auStack_2a8._80_16_ = auVar102 * ZEXT816(0x5363ad4cc05c30e0) + auVar145;
    psStack_2d0 = (secp256k1_ge *)0x14adfe;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)psStack_2c0,(uint64_t *)(auStack_2a8 + 0x20));
    psStack_2d0 = (secp256k1_ge *)0x14ae0d;
    secp256k1_scalar_negate((secp256k1_scalar *)psStack_2c0,(secp256k1_scalar *)psStack_2c0);
    psStack_2d0 = (secp256k1_ge *)0x14ae21;
    secp256k1_scalar_add
              ((secp256k1_scalar *)psStack_2c0,(secp256k1_scalar *)psStack_2c0,
               (secp256k1_scalar *)psStack_2b8);
    psVar160 = psStack_2c0;
    uVar161 = (psVar173->x).n[0];
    uVar174 = (psVar173->x).n[1];
    uVar156 = (psVar173->x).n[2];
    uVar162 = (psVar173->x).n[3];
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar161;
    uVar168 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar119,8);
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uVar168;
    auStack_2a8._32_8_ = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar119,0);
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar174;
    auVar120 = ZEXT816(0xdf02967c1b23bd72) * auVar120;
    uVar157 = SUB168(auVar120 + auVar152,0);
    uVar175 = SUB168(auVar120 + auVar152,8);
    auVar121._8_8_ = 0;
    auVar121._0_8_ = uVar161;
    uVar169 = SUB168(ZEXT816(0x122e22ea20816678) * auVar121,8);
    uVar163 = SUB168(ZEXT816(0x122e22ea20816678) * auVar121,0);
    auStack_2a8._40_8_ = uVar157 + uVar163;
    uVar163 = (ulong)CARRY8(uVar157,uVar163);
    uVar157 = uVar175 + uVar169;
    uVar164 = uVar157 + uVar163;
    uVar181 = (ulong)CARRY8(auVar120._8_8_,(ulong)CARRY8(uVar168,auVar120._0_8_)) +
              (ulong)(CARRY8(uVar175,uVar169) || CARRY8(uVar157,uVar163));
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uVar156;
    uVar165 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar122,8);
    uVar163 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar122,0);
    uVar168 = uVar164 + uVar163;
    uVar163 = (ulong)CARRY8(uVar164,uVar163);
    uVar169 = uVar181 + uVar165;
    uVar182 = uVar169 + uVar163;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = uVar174;
    uVar166 = SUB168(ZEXT816(0x122e22ea20816678) * auVar123,8);
    uVar157 = SUB168(ZEXT816(0x122e22ea20816678) * auVar123,0);
    uVar164 = uVar168 + uVar157;
    uVar157 = (ulong)CARRY8(uVar168,uVar157);
    uVar175 = uVar182 + uVar166;
    uVar176 = uVar175 + uVar157;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uVar161;
    uVar180 = SUB168(ZEXT816(0xa5261c028812645a) * auVar124,8);
    uVar168 = SUB168(ZEXT816(0xa5261c028812645a) * auVar124,0);
    auStack_2a8._48_8_ = uVar164 + uVar168;
    uVar168 = (ulong)CARRY8(uVar164,uVar168);
    uVar164 = uVar176 + uVar180;
    uVar183 = uVar164 + uVar168;
    uVar176 = (ulong)(CARRY8(uVar181,uVar165) || CARRY8(uVar169,uVar163)) +
              (ulong)(CARRY8(uVar182,uVar166) || CARRY8(uVar175,uVar157)) +
              (ulong)(CARRY8(uVar176,uVar180) || CARRY8(uVar164,uVar168));
    auVar125._8_8_ = 0;
    auVar125._0_8_ = uVar162;
    uVar166 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar125,8);
    uVar163 = SUB168(ZEXT816(0xdf02967c1b23bd72) * auVar125,0);
    uVar168 = uVar183 + uVar163;
    uVar163 = (ulong)CARRY8(uVar183,uVar163);
    uVar169 = uVar176 + uVar166;
    uVar183 = uVar169 + uVar163;
    a_02 = (secp256k1_modinv64_signed62 *)0x5363ad4cc05c30e0;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uVar156;
    uVar180 = SUB168(ZEXT816(0x122e22ea20816678) * auVar126,8);
    uVar157 = SUB168(ZEXT816(0x122e22ea20816678) * auVar126,0);
    uVar164 = uVar168 + uVar157;
    uVar157 = (ulong)CARRY8(uVar168,uVar157);
    uVar175 = uVar183 + uVar180;
    uVar177 = uVar175 + uVar157;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = uVar174;
    uVar181 = SUB168(ZEXT816(0xa5261c028812645a) * auVar127,8);
    uVar168 = SUB168(ZEXT816(0xa5261c028812645a) * auVar127,0);
    uVar165 = uVar164 + uVar168;
    uVar168 = (ulong)CARRY8(uVar164,uVar168);
    uVar164 = uVar177 + uVar181;
    uVar178 = uVar164 + uVar168;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uVar161;
    uVar182 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar128,8);
    uVar161 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar128,0);
    auStack_2a8._56_8_ = uVar165 + uVar161;
    uVar161 = (ulong)CARRY8(uVar165,uVar161);
    uVar165 = uVar178 + uVar182;
    uVar179 = uVar165 + uVar161;
    uVar180 = (ulong)(CARRY8(uVar176,uVar166) || CARRY8(uVar169,uVar163)) +
              (ulong)(CARRY8(uVar183,uVar180) || CARRY8(uVar175,uVar157)) +
              (ulong)(CARRY8(uVar177,uVar181) || CARRY8(uVar164,uVar168)) +
              (ulong)(CARRY8(uVar178,uVar182) || CARRY8(uVar165,uVar161));
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uVar162;
    uVar164 = SUB168(ZEXT816(0x122e22ea20816678) * auVar129,8);
    uVar161 = SUB168(ZEXT816(0x122e22ea20816678) * auVar129,0);
    uVar157 = uVar179 + uVar161;
    uVar161 = (ulong)CARRY8(uVar179,uVar161);
    uVar168 = uVar180 + uVar164;
    uVar181 = uVar168 + uVar161;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = uVar156;
    uVar165 = SUB168(ZEXT816(0xa5261c028812645a) * auVar130,8);
    uVar163 = SUB168(ZEXT816(0xa5261c028812645a) * auVar130,0);
    uVar175 = uVar157 + uVar163;
    uVar163 = (ulong)CARRY8(uVar157,uVar163);
    uVar169 = uVar181 + uVar165;
    uVar182 = uVar169 + uVar163;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = uVar174;
    uVar166 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar131,8);
    uVar157 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar131,0);
    auStack_2a8._64_8_ = uVar175 + uVar157;
    uVar157 = (ulong)CARRY8(uVar175,uVar157);
    uVar175 = uVar182 + uVar166;
    uVar176 = uVar175 + uVar157;
    uVar164 = (ulong)(CARRY8(uVar180,uVar164) || CARRY8(uVar168,uVar161)) +
              (ulong)(CARRY8(uVar181,uVar165) || CARRY8(uVar169,uVar163)) +
              (ulong)(CARRY8(uVar182,uVar166) || CARRY8(uVar175,uVar157));
    auVar132._8_8_ = 0;
    auVar132._0_8_ = uVar162;
    uVar169 = SUB168(ZEXT816(0xa5261c028812645a) * auVar132,8);
    uVar161 = SUB168(ZEXT816(0xa5261c028812645a) * auVar132,0);
    uVar168 = uVar176 + uVar161;
    uVar161 = (ulong)CARRY8(uVar176,uVar161);
    uVar157 = uVar164 + uVar169;
    uVar165 = uVar157 + uVar161;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = uVar156;
    uVar175 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar133,8);
    uVar163 = SUB168(ZEXT816(0x5363ad4cc05c30e0) * auVar133,0);
    auStack_2a8._72_8_ = uVar168 + uVar163;
    uVar163 = (ulong)CARRY8(uVar168,uVar163);
    uVar168 = uVar165 + uVar175;
    auVar146._8_8_ =
         (ulong)(CARRY8(uVar164,uVar169) || CARRY8(uVar157,uVar161)) +
         (ulong)(CARRY8(uVar165,uVar175) || CARRY8(uVar168,uVar163));
    auVar146._0_8_ = uVar168 + uVar163;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = uVar162;
    auStack_2a8._80_16_ = ZEXT816(0x5363ad4cc05c30e0) * auVar134 + auVar146;
    psVar171 = (secp256k1_ge *)auStack_2a8;
    psStack_2d0 = (secp256k1_ge *)0x14af86;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)psVar171,(uint64_t *)(auStack_2a8 + 0x20));
    psStack_2d0 = (secp256k1_ge *)0x14af94;
    psVar172 = psVar171;
    a_00 = psVar171;
    secp256k1_scalar_add
              ((secp256k1_scalar *)psVar171,(secp256k1_scalar *)psVar171,
               (secp256k1_scalar *)psVar160);
    if ((((auStack_2a8._0_8_ != (psStack_2b8->x).n[0]) ||
         (auStack_2a8._8_8_ != (psStack_2b8->x).n[1])) ||
        (auStack_2a8._16_8_ != (psStack_2b8->x).n[2])) ||
       (auStack_2a8._24_8_ != (psStack_2b8->x).n[3])) goto LAB_0014b112;
    psVar171 = (secp256k1_ge *)auStack_2a8;
    psStack_2d0 = (secp256k1_ge *)0x14afe2;
    secp256k1_scalar_negate((secp256k1_scalar *)psVar171,(secp256k1_scalar *)psVar160);
    psStack_2d0 = (secp256k1_ge *)0x14afef;
    secp256k1_scalar_get_b32(auStack_2a8 + 0x20,(secp256k1_scalar *)psVar160);
    psStack_2d0 = (secp256k1_ge *)0x14afff;
    secp256k1_scalar_get_b32(abStack_228,(secp256k1_scalar *)psVar171);
    a_01 = psStack_2b0;
    psVar159 = (secp256k1_ge *)0x0;
    uVar161 = extraout_RDX_00;
    do {
      uVar162 = uVar161 & 0xffffffff;
      bVar1 = (auStack_2a8 + 0x20)[(long)(psVar159->x).n];
      bVar2 = (byte)psVar159[0x3dd6].infinity;
      uVar161 = (ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        uVar161 = uVar162;
      }
      iVar153 = (int)uVar161;
      if (bVar1 != bVar2) goto LAB_0014b02c;
      psVar159 = (secp256k1_ge *)((long)(psVar159->x).n + 1);
    } while (psVar159 != (secp256k1_ge *)0x20);
    iVar153 = 0;
LAB_0014b02c:
    if (-1 < iVar153) {
      lVar167 = 0;
      do {
        psVar172 = (secp256k1_ge *)((ulong)psVar159 & 0xffffffff);
        bVar1 = abStack_228[lVar167];
        a_00 = (secp256k1_ge *)(ulong)bVar1;
        bVar2 = (&secp256k1_scalar_split_lambda_verify_k1_bound)[lVar167];
        psVar159 = (secp256k1_ge *)(ulong)((uint)bVar1 - (uint)bVar2);
        if (bVar1 == bVar2) {
          psVar159 = psVar172;
        }
        iVar153 = (int)psVar159;
        if (bVar1 != bVar2) goto LAB_0014b059;
        lVar167 = lVar167 + 1;
      } while (lVar167 != 0x20);
      iVar153 = 0;
LAB_0014b059:
      if (iVar153 < 0) goto LAB_0014b061;
      goto LAB_0014b117;
    }
LAB_0014b061:
    psVar171 = (secp256k1_ge *)auStack_2a8;
    psStack_2d0 = (secp256k1_ge *)0x14b076;
    secp256k1_scalar_negate((secp256k1_scalar *)psVar171,(secp256k1_scalar *)psStack_2b0);
    psStack_2d0 = (secp256k1_ge *)0x14b083;
    secp256k1_scalar_get_b32(auStack_2a8 + 0x20,(secp256k1_scalar *)a_01);
    psStack_2d0 = (secp256k1_ge *)0x14b093;
    secp256k1_scalar_get_b32(abStack_228,(secp256k1_scalar *)psVar171);
    psVar160 = (secp256k1_ge *)0x0;
    uVar161 = extraout_RDX_01;
    do {
      uVar162 = uVar161 & 0xffffffff;
      bVar1 = (auStack_2a8 + 0x20)[(long)(psVar160->x).n];
      bVar2 = (byte)psVar160[0x3dd7].x.n[3];
      uVar161 = (ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        uVar161 = uVar162;
      }
      iVar153 = (int)uVar161;
      if (bVar1 != bVar2) goto LAB_0014b0c0;
      psVar160 = (secp256k1_ge *)((long)(psVar160->x).n + 1);
    } while (psVar160 != (secp256k1_ge *)0x20);
    iVar153 = 0;
LAB_0014b0c0:
    if (iVar153 < 0) {
      return;
    }
    lVar167 = 0;
    do {
      psVar172 = (secp256k1_ge *)((ulong)psVar160 & 0xffffffff);
      bVar1 = abStack_228[lVar167];
      a_00 = (secp256k1_ge *)(ulong)bVar1;
      bVar2 = (&secp256k1_scalar_split_lambda_verify_k2_bound)[lVar167];
      psVar160 = (secp256k1_ge *)(ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        psVar160 = psVar172;
      }
      iVar153 = (int)psVar160;
      if (bVar1 != bVar2) goto LAB_0014b0ed;
      lVar167 = lVar167 + 1;
    } while (lVar167 != 0x20);
    iVar153 = 0;
LAB_0014b0ed:
    if (iVar153 < 0) {
      return;
    }
  }
  psStack_2d0 = (secp256k1_ge *)secp256k1_wnaf_const;
  secp256k1_scalar_split_lambda_cold_2();
  auStack_320._0_8_ = (psVar172->x).n[0];
  auStack_320._8_8_ = (psVar172->x).n[1];
  auStack_320._16_8_ = (psVar172->x).n[2];
  auStack_320._24_8_ = (psVar172->x).n[3];
  auStack_320._40_8_ = psVar171;
  uStack_2f0 = uVar174;
  uStack_2e8 = uVar156;
  psStack_2e0 = a_01;
  psStack_2d8 = a_02;
  psStack_2d0 = psVar173;
  if ((int)n < 1) {
LAB_0014b285:
    secp256k1_wnaf_const_cold_5();
  }
  else {
    uVar155 = (uint)((ulong)auStack_320._24_8_ >> 0x3f);
    uVar158 = uVar155 ^ 1;
    iVar153 = 0;
    uVar170 = uVar158;
    if (auStack_320._16_8_ == 0xffffffffffffffff) {
      uVar170 = 0;
    }
    if (0x5d576e7357a4501c < (ulong)auStack_320._8_8_) {
      uVar158 = 0;
    }
    uVar158 = (uVar158 | uVar170 | (ulong)auStack_320._24_8_ < 0x7fffffffffffffff) ^ 1;
    uVar170 = 0;
    if (0xdfe92f46681b20a0 < (ulong)auStack_320._0_8_) {
      uVar170 = uVar158;
    }
    if (0x5d576e7357a4501d < (ulong)auStack_320._8_8_) {
      uVar170 = uVar158;
    }
    uVar170 = uVar170 | uVar155;
    secp256k1_scalar_cadd_bit
              ((secp256k1_scalar *)auStack_320,0,(uint)auStack_320._0_8_ & 1 ^ uVar170 ^ 1);
    iVar154 = secp256k1_scalar_cond_negate((secp256k1_scalar *)auStack_320,uVar170);
    uVar170 = secp256k1_scalar_shr_int((secp256k1_scalar *)auStack_320,n);
    uVar174 = 0;
    do {
      psVar171 = (secp256k1_ge *)auStack_320;
      psVar172 = (secp256k1_ge *)(ulong)n;
      uVar155 = secp256k1_scalar_shr_int((secp256k1_scalar *)psVar171,n);
      if ((int)uVar170 < 1) {
        secp256k1_wnaf_const_cold_4();
LAB_0014b280:
        a_00 = psVar171;
        secp256k1_wnaf_const_cold_3();
        goto LAB_0014b285;
      }
      if ((uVar170 & 1) == 0) goto LAB_0014b280;
      uVar158 = uVar155 + (~uVar155 & 1);
      bVar1 = (byte)n & 0x1f;
      *(uint *)((long)(a_00->x).n + uVar174 * 4) = (uVar170 - ((~uVar155 & 1) << bVar1)) * iVar154;
      uVar174 = uVar174 + 1;
      iVar153 = iVar153 + n;
      uVar170 = uVar158;
    } while (iVar153 < 0x80);
    iVar154 = uVar158 * iVar154;
    *(int *)((long)(a_00->x).n + (uVar174 & 0xffffffff) * 4) = iVar154;
    auVar186._0_4_ = -(uint)(auStack_320._0_4_ == 0 && auStack_320._16_4_ == 0);
    auVar186._4_4_ = -(uint)(auStack_320._4_4_ == 0 && auStack_320._20_4_ == 0);
    auVar186._8_4_ = -(uint)(auStack_320._8_4_ == 0 && auStack_320._24_4_ == 0);
    auVar186._12_4_ = -(uint)(auStack_320._12_4_ == 0 && auStack_320._28_4_ == 0);
    iVar153 = movmskps(iVar154,auVar186);
    a_00 = psVar171;
    if (iVar153 == 0xf) {
      if ((int)uVar174 == (int)(CONCAT44(0 << bVar1,n + 0x7f) / (ulong)n)) {
        return;
      }
      goto LAB_0014b28f;
    }
  }
  secp256k1_wnaf_const_cold_1();
LAB_0014b28f:
  secp256k1_wnaf_const_cold_2();
  psVar171 = psVar172;
  psVar173 = a_00;
  for (lVar167 = 0xd; lVar167 != 0; lVar167 = lVar167 + -1) {
    (psVar173->x).n[0] = (psVar171->x).n[0];
    psVar171 = (secp256k1_ge *)((long)psVar171 + (ulong)bVar184 * -0x10 + 8);
    psVar173 = (secp256k1_ge *)((long)psVar173 + (ulong)bVar184 * -0x10 + 8);
  }
  secp256k1_ge_verify(psVar172);
  secp256k1_fe_mul(&a_00->x,&a_00->x,&secp256k1_const_beta);
  secp256k1_ge_verify(a_00);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_cmov(secp256k1_fe *r, const secp256k1_fe *a, int flag) {
    VERIFY_CHECK(flag == 0 || flag == 1);
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(r);
    secp256k1_fe_impl_cmov(r, a, flag);
    if (a->magnitude > r->magnitude) r->magnitude = a->magnitude;
    if (!a->normalized) r->normalized = 0;
    secp256k1_fe_verify(r);
}